

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O1

int lest::run<12ul>(test (*specification) [12],ostream *os)

{
  undefined8 uVar1;
  long lVar2;
  _Any_data *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  p_Var3 = (_Any_data *)&(*specification)[0].behaviour;
  lVar2 = 0x300;
  do {
    if (*(long *)(p_Var3 + 1) == 0) {
      uVar1 = std::__throw_bad_function_call();
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      __cxa_end_catch();
      _Unwind_Resume(uVar1);
    }
    (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3);
    p_Var3 = p_Var3 + 4;
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  return 0;
}

Assistant:

int run( test const (&specification)[N], std::ostream & os = std::cout )
{
    int failures = 0;

    for ( auto & testing : specification )
    {
        try
        {
            testing.behaviour();
        }
        catch( message const & e )
        {
            ++failures;
            report( os, e, testing.name );
        }
    }

    if ( failures > 0 )
    {
        os << failures << " out of " << N << " " << pluralise("test", N) << " failed." << std::endl;
    }

    return failures;
}